

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::calcViscosity(PeleLM *this,Real time,Real param_2,int param_3,int param_4)

{
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *pTVar1;
  int iVar2;
  int iVar3;
  Long LVar4;
  double *pdVar5;
  Long LVar6;
  Long LVar7;
  double *pdVar8;
  Long LVar9;
  Long LVar10;
  int n;
  TimeLevel TVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  Box local_374;
  Array4<const_double> local_358;
  Array4<double> local_318;
  Array4<const_double> local_2d8;
  MFIter mfi;
  double local_238 [22];
  Real muloc [21];
  Real Xloc [21];
  
  TVar11 = amrex::AmrLevel::which_time((AmrLevel *)this,0,time);
  pTVar1 = trans_parms.m_d_trans_parm;
  this_00 = &(&(this->super_NavierStokesBase).viscn_cc)[TVar11 != AmrOldTime]->
             super_FabArray<amrex::FArrayBox>;
  this_01 = *(FabArray<amrex::FArrayBox> **)
             (&((this->super_NavierStokesBase).super_AmrLevel.state.
                super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                super__Vector_impl_data._M_start)->new_data + (TVar11 == AmrOldTime));
  amrex::MFIter::MFIter(&mfi,&this_01->super_FabArrayBase,true);
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox(&local_374,&mfi,-1000000);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_358,this_01,&mfi,first_spec);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_2d8,this_01,&mfi,NavierStokesBase::Temp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_318,this_00,&mfi);
    LVar10 = local_2d8.kstride;
    LVar9 = local_2d8.jstride;
    pdVar8 = local_2d8.p;
    LVar7 = local_318.kstride;
    LVar6 = local_318.jstride;
    pdVar5 = local_318.p;
    LVar4 = local_358.nstride;
    iVar3 = local_374.bigend.vect[0];
    iVar2 = local_374.smallend.vect[0];
    lVar22 = (long)local_2d8.begin.x;
    lVar23 = (long)local_2d8.begin.y;
    lVar24 = (long)local_2d8.begin.z;
    lVar25 = (long)local_374.smallend.vect[1];
    lVar28 = (long)local_374.smallend.vect[2];
    lVar26 = local_358.jstride * 8;
    lVar27 = local_358.kstride * 8;
    lVar29 = (lVar28 - local_358.begin.z) * lVar27 + (lVar25 - local_358.begin.y) * lVar26 +
             (long)local_358.begin.x * -8 + (long)local_358.p;
    lVar13 = (long)local_318.begin.x;
    lVar14 = (long)local_318.begin.y;
    lVar15 = (long)local_318.begin.z;
    lVar16 = (long)local_374.bigend.vect[1];
    lVar17 = (long)local_374.bigend.vect[2];
    for (; lVar28 <= lVar17; lVar28 = lVar28 + 1) {
      lVar30 = lVar29;
      for (lVar19 = lVar25; lVar19 <= lVar16; lVar19 = lVar19 + 1) {
        if (iVar2 <= iVar3) {
          iVar12 = iVar2;
          do {
            lVar21 = (long)iVar12;
            pdVar31 = (double *)(lVar30 + lVar21 * 8);
            dVar33 = 0.0;
            lVar18 = 0x15;
            pdVar20 = pdVar31;
            while (bVar32 = lVar18 != 0, lVar18 = lVar18 + -1, bVar32) {
              dVar33 = dVar33 + *pdVar20;
              pdVar20 = pdVar20 + LVar4;
            }
            memset(local_238,0,0xa8);
            for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
              local_238[lVar18] = *pdVar31 * (1.0 / dVar33);
              pdVar31 = pdVar31 + LVar4;
            }
            dVar33 = pdVar8[(lVar28 - lVar24) * LVar10 +
                            (lVar19 - lVar23) * LVar9 + (lVar21 - lVar22)];
            memset(Xloc,0,0xa8);
            memset(muloc,0,0xa8);
            dVar33 = log(dVar33);
            dVar34 = 0.0;
            for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
              dVar34 = dVar34 + local_238[lVar18];
            }
            for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
              local_238[lVar18] = (dVar34 / 21.0 - local_238[lVar18]) * 1e-15 + local_238[lVar18];
            }
            dVar34 = 0.0;
            for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
              dVar34 = dVar34 + local_238[lVar18] * (pTVar1->iwt).arr[lVar18];
            }
            for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
              Xloc[lVar18] = local_238[lVar18] * (1.0 / dVar34) * (pTVar1->iwt).arr[lVar18];
            }
            for (lVar18 = 0; lVar18 != 0xa8; lVar18 = lVar18 + 8) {
              dVar34 = exp(*(double *)((long)(pTVar1->fitmu).arr + lVar18 * 4 + 0x18) *
                           dVar33 * dVar33 * dVar33 +
                           *(double *)((long)(pTVar1->fitmu).arr + lVar18 * 4 + 0x10) *
                           dVar33 * dVar33 +
                           *(double *)((long)(pTVar1->fitmu).arr + lVar18 * 4 + 8) * dVar33 +
                           *(double *)((long)(pTVar1->fitmu).arr + lVar18 * 4));
              *(double *)((long)muloc + lVar18) = dVar34;
            }
            dVar33 = 0.0;
            for (lVar18 = 0; lVar18 != 0x15; lVar18 = lVar18 + 1) {
              dVar34 = muloc[lVar18];
              dVar33 = dVar33 + dVar34 * dVar34 * dVar34 * dVar34 * dVar34 * dVar34 * Xloc[lVar18];
            }
            if (dVar33 < 0.0) {
              dVar33 = sqrt(dVar33);
            }
            else {
              dVar33 = SQRT(dVar33);
            }
            dVar33 = cbrt(dVar33);
            pdVar5[(lVar28 - lVar15) * LVar7 + (lVar19 - lVar14) * LVar6 + (lVar21 - lVar13)] =
                 dVar33 * 0.1;
            bVar32 = iVar12 != iVar3;
            iVar12 = iVar12 + 1;
          } while (bVar32);
        }
        lVar30 = lVar30 + lVar26;
      }
      lVar29 = lVar29 + lVar27;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
PeleLM::calcViscosity (const Real time,
                       const Real /*dt*/,
                       const int  /*iteration*/,
                       const int  /*ncycle*/)
{
   BL_PROFILE("PLM::calcViscosity()");

   const TimeLevel whichTime = which_time(State_Type, time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);

   MultiFab& visc = (whichTime == AmrOldTime ? *viscn_cc : *viscnp1_cc);
   // --> We assume the class state data has been properly FillPatched already !
   const MultiFab& S = (whichTime == AmrOldTime) ? get_old_data(State_Type) : get_new_data(State_Type);

   // Get the transport GPU data pointer
   auto const* ltransparm = trans_parms.device_trans_parm();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S, TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& gbx = mfi.growntilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& mu      = visc.array(mfi);
      amrex::ParallelFor(gbx, [rhoY, T, mu, ltransparm]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         getVelViscosity( i, j, k, rhoY, T, mu, ltransparm);
      });
   }
}